

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_31fbb::schema_ref::schema_ref(schema_ref *this,string *id,root_schema *root)

{
  schema::schema(&this->super_schema,root);
  (this->super_schema)._vptr_schema = (_func_int **)&PTR_make_for_default__00151078;
  std::__cxx11::string::string((string *)&this->id_,(string *)id);
  (this->target_strong_).
  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->target_strong_).
  super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->target_).super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->target_).super___weak_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

schema_ref(const std::string &id, root_schema *root)
	    : schema(root), id_(id) {}